

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_17898ce::BlendA64Mask1DTest8B_RandomValues_Test::TestBody
          (BlendA64Mask1DTest8B_RandomValues_Test *this)

{
  ACMRandom *this_00;
  uint8_t uVar1;
  uint32_t uVar2;
  int bsize;
  int block_size;
  long lVar3;
  
  this_00 = &(this->super_BlendA64Mask1DTest8B).
             super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int)>
             .rng_;
  for (block_size = 0; block_size != 0x16; block_size = block_size + 1) {
    for (lVar3 = 0x3c048; lVar3 != 0x50048; lVar3 = lVar3 + 1) {
      uVar1 = libaom_test::ACMRandom::Rand8(this_00);
      *(uint8_t *)((long)this + lVar3 + -0x3c010) = uVar1;
      uVar1 = libaom_test::ACMRandom::Rand8(this_00);
      *(uint8_t *)((long)this + lVar3 + -0x28010) = uVar1;
      uVar1 = libaom_test::ACMRandom::Rand8(this_00);
      *(uint8_t *)((long)this + lVar3 + -0x14008) = uVar1;
      uVar1 = libaom_test::ACMRandom::Rand8(this_00);
      (this->super_BlendA64Mask1DTest8B).
      super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
      .dst_ref_[lVar3 + -0x38] = uVar1;
    }
    for (lVar3 = 0x50050; lVar3 != 0x50150; lVar3 = lVar3 + 1) {
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x41);
      (this->super_BlendA64Mask1DTest8B).
      super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
      .dst_ref_[lVar3 + -0x38] = (uchar)uVar2;
    }
    BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
    ::Common((BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int),_unsigned_char>
              *)this,block_size);
  }
  return;
}

Assistant:

TEST_P(BlendA64Mask1DTest8B, RandomValues) {
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_.Rand8();
      dst_tst_[i] = rng_.Rand8();

      src0_[i] = rng_.Rand8();
      src1_[i] = rng_.Rand8();
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

    Common(bsize);
  }
}